

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::RandomWalkIntegrator::LiRandomWalk
          (RandomWalkIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,int depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  array<float,_4> aVar18;
  bool bVar19;
  SampledWavelengths *in_RCX;
  RayDifferential *in_RDX;
  RandomWalkIntegrator *in_RSI;
  long in_RDI;
  SamplerHandle *in_R8;
  int in_R9D;
  Point2f PVar20;
  undefined8 uVar23;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar24;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar26 [64];
  Vector3<float> VVar28;
  Vector3f VVar29;
  SampledSpectrum SVar30;
  SampledSpectrum beta;
  Vector3f wo;
  Vector3f wi;
  Point2f u;
  BSDF bsdf;
  SurfaceInteraction *isect;
  LightHandle light;
  const_iterator __end2;
  const_iterator __begin2;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *__range2;
  optional<pbrt::ShapeIntersection> si;
  SampledSpectrum L;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_fffffffffffffa38;
  RayDifferential *n;
  undefined4 in_stack_fffffffffffffa40;
  Float in_stack_fffffffffffffa44;
  undefined4 in_stack_fffffffffffffa48;
  Float in_stack_fffffffffffffa4c;
  Ray *in_stack_fffffffffffffa50;
  Integrator *in_stack_fffffffffffffa58;
  SampledWavelengths *in_stack_fffffffffffffa60;
  Vector3f *in_stack_fffffffffffffa68;
  SurfaceInteraction *in_stack_fffffffffffffa70;
  Vector3f *in_stack_fffffffffffffa80;
  Interaction *in_stack_fffffffffffffa88;
  TransportMode in_stack_fffffffffffffb0c;
  BSDF *in_stack_fffffffffffffb10;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffffb28;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  CameraHandle *in_stack_fffffffffffffdd0;
  SampledWavelengths *in_stack_fffffffffffffdd8;
  RayDifferential *in_stack_fffffffffffffde0;
  SurfaceInteraction *in_stack_fffffffffffffde8;
  SamplerHandle *in_stack_fffffffffffffe00;
  __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
  local_178;
  long local_170;
  optional local_158 [268];
  undefined8 local_4c;
  undefined4 in_stack_ffffffffffffffbc;
  int depth_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar31;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar25 [56];
  undefined1 auVar27 [56];
  
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
             (Float)((ulong)in_stack_fffffffffffffa38 >> 0x20));
  auVar21 = ZEXT464(0x7f800000);
  Integrator::Intersect
            (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c);
  bVar19 = pstd::optional::operator_cast_to_bool(local_158);
  auVar25 = auVar21._8_56_;
  if (bVar19) {
    pstd::optional<pbrt::ShapeIntersection>::operator->
              ((optional<pbrt::ShapeIntersection> *)0x7dd77a);
    VVar28 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
    auVar21._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar21._8_56_ = auVar25;
    uVar23 = 0;
    uVar24 = auVar25._0_8_;
    vmovlpd_avx(auVar21._0_16_);
    SVar30 = SurfaceInteraction::Le
                       (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                        in_stack_fffffffffffffa60);
    auVar16._8_8_ = uVar24;
    auVar16._0_8_ = SVar30.values.values._8_8_;
    auVar17._8_8_ = uVar23;
    auVar17._0_8_ = SVar30.values.values._0_8_;
    local_4c = vmovlpd_avx(auVar17);
    local_8 = vmovlpd_avx(auVar16);
    depth_00 = (int)local_8;
    uVar31 = (undefined4)((ulong)local_8 >> 0x20);
    local_10 = local_4c;
    if (in_R9D != *(int *)(in_RDI + 0x68)) {
      CameraHandle::CameraHandle
                ((CameraHandle *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (CameraHandle *)in_stack_fffffffffffffa38);
      SamplerHandle::SamplerHandle
                ((SamplerHandle *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (SamplerHandle *)in_stack_fffffffffffffa38);
      n = (RayDifferential *)&stack0xfffffffffffffdd8;
      SurfaceInteraction::GetBSDF
                (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 in_stack_fffffffffffffdd0,
                 (ScratchBuffer *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 in_stack_fffffffffffffe00);
      bVar19 = BSDF::operator_cast_to_bool((BSDF *)0x7dd978);
      if (bVar19) {
        PVar20 = SamplerHandle::Get2D((SamplerHandle *)n);
        auVar15._8_8_ = extraout_XMM0_Qb;
        auVar15._0_4_ = PVar20.super_Tuple2<pbrt::Point2,_float>.x;
        auVar15._4_4_ = PVar20.super_Tuple2<pbrt::Point2,_float>.y;
        vmovlpd_avx(auVar15);
        uVar24 = extraout_XMM0_Qb;
        VVar29 = SampleUniformSphere((Point2f *)in_stack_fffffffffffffa60);
        uVar23 = 0;
        auVar14._8_8_ = uVar24;
        auVar14._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        vmovlpd_avx(auVar14);
        VVar28 = Tuple3<pbrt::Vector3,_float>::operator-
                           ((Tuple3<pbrt::Vector3,_float> *)
                            CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
        auVar13._8_8_ = uVar23;
        auVar13._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        vmovlpd_avx(auVar13);
        uVar24 = 0;
        uVar23 = 0;
        SVar30 = BSDF::f(in_stack_fffffffffffffb10,(Vector3f)in_stack_fffffffffffffb48,
                         (Vector3f)in_stack_fffffffffffffb28,in_stack_fffffffffffffb0c);
        auVar11._8_8_ = uVar23;
        auVar11._0_8_ = SVar30.values.values._8_8_;
        auVar12._8_8_ = uVar24;
        auVar12._0_8_ = SVar30.values.values._0_8_;
        vmovlpd_avx(auVar12);
        vmovlpd_avx(auVar11);
        AbsDot<float>((Vector3<float> *)
                      CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                      (Normal3<float> *)n);
        uVar23 = 0;
        SVar30 = SampledSpectrum::operator*
                           ((SampledSpectrum *)
                            CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            (Float)((ulong)n >> 0x20));
        auVar9._8_8_ = uVar24;
        auVar9._0_8_ = SVar30.values.values._8_8_;
        auVar10._8_8_ = uVar23;
        auVar10._0_8_ = SVar30.values.values._0_8_;
        vmovlpd_avx(auVar10);
        vmovlpd_avx(auVar9);
        uVar24 = 0;
        SVar30 = SampledSpectrum::operator/
                           ((SampledSpectrum *)
                            CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                            in_stack_fffffffffffffa44);
        auVar7._8_8_ = uVar23;
        auVar7._0_8_ = SVar30.values.values._8_8_;
        auVar8._8_8_ = uVar24;
        auVar8._0_8_ = SVar30.values.values._0_8_;
        vmovlpd_avx(auVar8);
        vmovlpd_avx(auVar7);
        bVar19 = SampledSpectrum::operator_cast_to_bool
                           ((SampledSpectrum *)
                            CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
        if (bVar19) {
          Interaction::SpawnRay(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
          RayDifferential::operator=
                    ((RayDifferential *)
                     CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),n);
          RayDifferential::RayDifferential
                    ((RayDifferential *)
                     CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),n);
          SamplerHandle::SamplerHandle
                    ((SamplerHandle *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                     (SamplerHandle *)n);
          SVar30 = LiRandomWalk(in_RSI,in_RDX,in_RCX,in_R8,(ScratchBuffer *)CONCAT44(in_R9D,uVar31),
                                depth_00);
          auVar5._8_8_ = uVar24;
          auVar5._0_8_ = SVar30.values.values._8_8_;
          auVar6._8_8_ = uVar23;
          auVar6._0_8_ = SVar30.values.values._0_8_;
          vmovlpd_avx(auVar6);
          vmovlpd_avx(auVar5);
          SVar30 = SampledSpectrum::operator*
                             ((SampledSpectrum *)
                              CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                              (SampledSpectrum *)
                              CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
          auVar3._8_8_ = uVar23;
          auVar3._0_8_ = SVar30.values.values._8_8_;
          auVar4._8_8_ = uVar24;
          auVar4._0_8_ = SVar30.values.values._0_8_;
          vmovlpd_avx(auVar4);
          vmovlpd_avx(auVar3);
          SVar30 = SampledSpectrum::operator+
                             ((SampledSpectrum *)
                              CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                              (SampledSpectrum *)
                              CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
          auVar1._8_8_ = uVar24;
          auVar1._0_8_ = SVar30.values.values._8_8_;
          auVar2._8_8_ = uVar23;
          auVar2._0_8_ = SVar30.values.values._0_8_;
          local_10 = vmovlpd_avx(auVar2);
          local_8 = vmovlpd_avx(auVar1);
        }
        else {
          local_10 = local_4c;
          local_8 = CONCAT44(uVar31,depth_00);
        }
      }
      else {
        local_10 = local_4c;
        local_8 = CONCAT44(uVar31,depth_00);
      }
    }
  }
  else {
    local_170 = in_RDI + 0x28;
    local_178._M_current =
         (LightHandle *)
         std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::begin
                   (in_stack_fffffffffffffa38);
    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::end
              (in_stack_fffffffffffffa38);
    while( true ) {
      auVar27 = in_ZMM1._8_56_;
      auVar25 = auVar21._8_56_;
      bVar19 = __gnu_cxx::operator!=
                         ((__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                           *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                          (__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                           *)in_stack_fffffffffffffa38);
      if (!bVar19) break;
      __gnu_cxx::
      __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
      ::operator*(&local_178);
      LightHandle::LightHandle
                ((LightHandle *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (LightHandle *)in_stack_fffffffffffffa38);
      SVar30 = LightHandle::Le((LightHandle *)in_stack_fffffffffffffa60,
                               (Ray *)in_stack_fffffffffffffa58,
                               (SampledWavelengths *)in_stack_fffffffffffffa50);
      auVar26._0_8_ = SVar30.values.values._8_8_;
      auVar26._8_56_ = auVar27;
      auVar22._0_8_ = SVar30.values.values._0_8_;
      auVar22._8_56_ = auVar25;
      auVar21 = ZEXT1664(auVar26._0_16_);
      in_ZMM1 = ZEXT1664(auVar22._0_16_);
      vmovlpd_avx(auVar22._0_16_);
      vmovlpd_avx(auVar26._0_16_);
      SampledSpectrum::operator+=
                ((SampledSpectrum *)in_stack_fffffffffffffa50,
                 (SampledSpectrum *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      __gnu_cxx::
      __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
      ::operator++(&local_178);
    }
    local_10 = local_4c;
    local_8 = CONCAT44(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional((optional<pbrt::ShapeIntersection> *)0x7dde0d);
  aVar18.values[2] = (float)(undefined4)local_8;
  aVar18.values[3] = (float)local_8._4_4_;
  aVar18.values[0] = (float)(undefined4)local_10;
  aVar18.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar18.values;
}

Assistant:

SampledSpectrum RandomWalkIntegrator::LiRandomWalk(RayDifferential ray,
                                                   SampledWavelengths &lambda,
                                                   SamplerHandle sampler,
                                                   ScratchBuffer &scratchBuffer,
                                                   int depth) const {
    SampledSpectrum L(0.f);
    // Intersect ray with scene and return if no intersection
    pstd::optional<ShapeIntersection> si = Intersect(ray);
    if (!si) {
        // Return emitted light from infinite light sources
        for (LightHandle light : infiniteLights)
            L += light.Le(ray, lambda);
        return L;
    }
    SurfaceInteraction &isect = si->intr;

    // Get emitted radiance at surface intersection
    L = isect.Le(-ray.d, lambda);

    // Terminate random walk if maximum depth has been reached
    if (depth == maxDepth)
        return L;

    // Compute BSDF at random walk intersection point
    BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
    if (!bsdf)
        return L;

    // Randomly sample direction leaving surface for random walk
    Point2f u = sampler.Get2D();
    Vector3f wi = SampleUniformSphere(u);

    // Evaluate BSDF at surface for sampled direction
    Vector3f wo = -ray.d;
    SampledSpectrum beta = bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n) / (1 / (4 * Pi));
    if (!beta)
        return L;

    // Recursively trace ray to estimate incident radiance at surface
    ray = isect.SpawnRay(wi);
    return L + beta * LiRandomWalk(ray, lambda, sampler, scratchBuffer, depth + 1);
}